

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O2

void __thiscall
PDFHummus::DocumentContext::WriteDateState
          (DocumentContext *this,ObjectsContext *inStateWriter,PDFDate *inDate)

{
  DictionaryContext *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = ObjectsContext::StartDictionary(inStateWriter);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Type",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Date",&local_39);
  DictionaryContext::WriteNameValue(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Year",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Year);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Month",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Month);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Day",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Day);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hour",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Hour);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Minute",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Minute);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Second",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->Second);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"UTC",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(ulong)inDate->UTC);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"HourFromUTC",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->HourFromUTC);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"MinuteFromUTC",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,(long)inDate->MinuteFromUTC);
  ObjectsContext::EndDictionary(inStateWriter,this_00);
  return;
}

Assistant:

void DocumentContext::WriteDateState(ObjectsContext* inStateWriter,const PDFDate& inDate)
{
	DictionaryContext* dateDictionary = inStateWriter->StartDictionary();

	dateDictionary->WriteKey("Type");
	dateDictionary->WriteNameValue("Date");

	dateDictionary->WriteKey("Year");
	dateDictionary->WriteIntegerValue(inDate.Year);

	dateDictionary->WriteKey("Month");
	dateDictionary->WriteIntegerValue(inDate.Month);

	dateDictionary->WriteKey("Day");
	dateDictionary->WriteIntegerValue(inDate.Day);

	dateDictionary->WriteKey("Hour");
	dateDictionary->WriteIntegerValue(inDate.Hour);

	dateDictionary->WriteKey("Minute");
	dateDictionary->WriteIntegerValue(inDate.Minute);

	dateDictionary->WriteKey("Second");
	dateDictionary->WriteIntegerValue(inDate.Second);

	dateDictionary->WriteKey("UTC");
	dateDictionary->WriteIntegerValue(inDate.UTC);

	dateDictionary->WriteKey("HourFromUTC");
	dateDictionary->WriteIntegerValue(inDate.HourFromUTC);

	dateDictionary->WriteKey("MinuteFromUTC");
	dateDictionary->WriteIntegerValue(inDate.MinuteFromUTC);

	inStateWriter->EndDictionary(dateDictionary);
}